

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O3

void __thiscall Clasp::mt::ParallelSolve::doStop(ParallelSolve *this)

{
  atomic<unsigned_int> *paVar1;
  SharedContext *pSVar2;
  ulong uVar3;
  int ec;
  char *fmt;
  long *plVar4;
  
  if (1 < this->shared_->nextId) {
    pSVar2 = this->shared_->ctx;
    SharedContext::report(pSVar2,"joining with other threads",*(pSVar2->solvers_).ebo_.buf);
    if (1 < (this->shared_->generator).ptr_) {
      LOCK();
      paVar1 = &this->shared_->control;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i | 1;
      UNLOCK();
      SharedData::Generator::notify
                ((Generator *)((this->shared_->generator).ptr_ & 0xfffffffffffffffe),done);
      if (((*this->thread_)->thread_)._M_id._M_thread != 0) {
        std::thread::join();
      }
    }
    ec = joinThreads(this);
    SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::reset
              (&this->shared_->generator,(Generator *)0x0);
    pSVar2 = this->shared_->ctx;
    uVar3 = (pSVar2->distributor).ptr_;
    plVar4 = (long *)(uVar3 & 0xfffffffffffffffe);
    if ((uVar3 & 1) != 0 && plVar4 != (long *)0x0) {
      (pSVar2->distributor).ptr_ = (uintp)plVar4;
      (**(code **)(*plVar4 + 8))();
    }
    (pSVar2->distributor).ptr_ = 1;
    if (ec != 0) {
      fmt = Potassco::StringBuilder::c_str(&this->shared_->msg);
      Potassco::fail(ec,"virtual void Clasp::mt::ParallelSolve::doStop()",0x197,"err == 0",fmt,0);
    }
  }
  return;
}

Assistant:

void ParallelSolve::doStop() {
	if (shared_->nextId <= 1) { return; }
	reportProgress(*shared_->ctx->master(), "joining with other threads");
	if (shared_->generator.get()) {
		shared_->setControl(SharedData::terminate_flag);
		shared_->generator->notify(SharedData::Generator::done);
		thread_[masterId]->join();
	}
	int err = joinThreads();
	shared_->generator = 0;
	shared_->ctx->distributor.reset(0);
	POTASSCO_CHECK(err == 0, err, shared_->msg.c_str());
}